

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStreamTest.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  int ret;
  
  Qentem::QTest::PrintInfo();
  iVar1 = Qentem::Test::RunStringStreamTests();
  Qentem::MemoryRecord::PrintMemoryStatus();
  return iVar1;
}

Assistant:

int main() {
    Qentem::QTest::PrintInfo();
    const int ret = Qentem::Test::RunStringStreamTests();
    Qentem::MemoryRecord::PrintMemoryStatus();

    return ret;
}